

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O3

void prune_intra_mode_with_hog
               (MACROBLOCK *x,BLOCK_SIZE bsize,BLOCK_SIZE sb_size,float th,
               uint8_t *directional_mode_skip_mask,int is_chroma)

{
  ushort *puVar1;
  long lVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  float *pfVar13;
  byte bVar14;
  byte bVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  undefined7 in_register_00000031;
  _Bool *p_Var20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ushort *puVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  long lVar32;
  int iVar33;
  int iVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float hist [32];
  float scores [8];
  undefined1 local_d8 [4];
  float afStack_d4 [3];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58 [10];
  int iVar31;
  
  bVar35 = is_chroma != 0;
  local_68 = ZEXT816(0);
  local_78 = local_68;
  local_88 = local_68;
  local_98 = local_68;
  local_a8 = local_68;
  local_b8 = local_68;
  local_c8 = local_68;
  _local_d8 = local_68;
  iVar4 = (x->e_mbd).plane[bVar35].subsampling_x;
  iVar5 = (x->e_mbd).plane[bVar35].subsampling_y;
  uVar21 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  iVar33 = (x->e_mbd).mb_to_right_edge;
  iVar28 = (x->e_mbd).mb_to_bottom_edge;
  bVar14 = (byte)iVar5;
  iVar28 = (int)((iVar28 >> 0x1f & iVar28 >> 3) + (uint)block_size_high[uVar21]) >> (bVar14 & 0x1f);
  bVar15 = (byte)iVar4;
  iVar33 = (int)((iVar33 >> 0x1f & iVar33 >> 3) + (uint)block_size_wide[uVar21]) >> (bVar15 & 0x1f);
  if (x->is_sb_gradient_cached[bVar35] == true) {
    bVar8 = block_size_wide[sb_size] >> (bVar15 & 0x1f);
    if (iVar28 < 3) {
      fVar38 = 0.1;
    }
    else {
      p_Var20 = &x->pixel_gradient_info
                 [(ulong)bVar8 +
                  (long)(int)((("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [sb_size] - 1 & (x->e_mbd).mi_col) << (2 - bVar15 & 0x1f)) +
                             (("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [sb_size] - 1 & (x->e_mbd).mi_row) << (2 - bVar14 & 0x1f)) *
                             (uint)bVar8) + (ulong)(is_chroma != 0) * 0x4000 + 1].is_dx_zero;
      fVar38 = 0.1;
      uVar21 = 1;
      do {
        if (2 < iVar33) {
          lVar22 = 0;
          do {
            uVar3 = *(ushort *)(p_Var20 + lVar22 * 4 + -3);
            if (uVar3 != 0) {
              if (p_Var20[lVar22 * 4] == true) {
                local_d8 = (undefined1  [4])((float)local_d8 + (float)(uVar3 >> 1));
                pfVar13 = (float *)(local_68 + 0xc);
                fVar37 = (float)(uVar3 >> 1);
              }
              else {
                pfVar13 = (float *)(local_d8 + (long)p_Var20[lVar22 * 4 + -1] * 4);
                fVar37 = (float)uVar3;
              }
              fVar38 = fVar38 + (float)uVar3;
              *pfVar13 = fVar37 + *pfVar13;
            }
            lVar22 = lVar22 + 1;
          } while ((ulong)(iVar33 - 1) - 1 != lVar22);
        }
        uVar21 = uVar21 + 1;
        p_Var20 = p_Var20 + (ulong)bVar8 * 4;
      } while (uVar21 != iVar28 - 1);
    }
    lVar22 = 0;
    do {
      auVar6._4_4_ = fVar38;
      auVar6._0_4_ = fVar38;
      auVar6._8_4_ = fVar38;
      auVar6._12_4_ = fVar38;
      auVar36 = divps(*(undefined1 (*) [16])(local_d8 + lVar22 * 4),auVar6);
      *(undefined1 (*) [16])(local_d8 + lVar22 * 4) = auVar36;
      lVar22 = lVar22 + 4;
    } while (lVar22 != 0x20);
  }
  else {
    uVar21 = (ulong)((uint)bVar35 * 0x80 + (uint)bVar35 * 8);
    lVar22 = *(long *)((long)&x->plane[0].src.buf + uVar21);
    lVar16 = (long)*(int *)((long)&x->plane[0].src.stride + uVar21);
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      if (iVar28 < 3) {
        fVar38 = 0.1;
      }
      else {
        fVar38 = 0.1;
        iVar11 = 1;
        do {
          lVar2 = lVar22 + lVar16;
          if (2 < iVar33) {
            lVar23 = lVar22 + lVar16 + -1;
            uVar21 = 1;
            do {
              lVar26 = lVar23 + uVar21;
              lVar25 = lVar2 + uVar21 + 1;
              uVar18 = (uint)*(byte *)(lVar16 + lVar25);
              iVar17 = (uint)*(byte *)(-lVar16 + lVar25) + (uint)*(byte *)(lVar2 + 1 + uVar21) * 2 +
                       uVar18;
              uVar30 = (uint)*(byte *)(lVar16 + lVar26);
              iVar24 = (uint)*(byte *)(-lVar16 + lVar26) + (uint)*(byte *)(lVar23 + uVar21) * 2 +
                       uVar30;
              iVar12 = uVar30 + uVar18 + (uint)*(byte *)(lVar2 + lVar16 + uVar21) * 2;
              iVar29 = (uint)*(byte *)(lVar22 + 1 + uVar21) +
                       (uint)*(byte *)(lVar22 + -1 + uVar21) + (uint)*(byte *)(lVar22 + uVar21) * 2;
              iVar34 = iVar17 - iVar24;
              if ((iVar34 != 0) || (iVar12 != iVar29)) {
                iVar12 = iVar12 - iVar29;
                iVar29 = -iVar34;
                if (0 < iVar34) {
                  iVar29 = iVar34;
                }
                iVar31 = -iVar12;
                if (0 < iVar12) {
                  iVar31 = iVar12;
                }
                uVar30 = iVar31 + iVar29;
                if (uVar30 != 0) {
                  if (iVar17 == iVar24) {
                    local_d8 = (undefined1  [4])((float)local_d8 + (float)(uVar30 >> 1));
                    pfVar13 = (float *)(local_68 + 0xc);
                    fVar37 = (float)(uVar30 >> 1);
                  }
                  else {
                    iVar34 = (iVar12 * 0x10000) / iVar34;
                    if (iVar34 < -0x11a6e) {
                      lVar25 = 8;
                      lVar26 = 0;
                    }
                    else if (iVar34 < -0xc79) {
                      lVar25 = 0x10;
                      lVar26 = 8;
                    }
                    else {
                      lVar25 = (ulong)(0xe821 < iVar34) * 8;
                      lVar26 = lVar25 + 0x10;
                      lVar25 = lVar25 + 0x18;
                    }
                    lVar19 = lVar26 << 0x20;
                    lVar32 = 0;
                    do {
                      if (iVar34 <= *(int *)((long)&get_hist_bin_idx_thresholds +
                                            (ulong)(uint)((int)lVar26 << 2) + lVar32 * 4)) {
                        lVar19 = lVar19 >> 0x20;
                        goto LAB_00ab00df;
                      }
                      lVar19 = lVar19 + 0x100000000;
                      lVar32 = lVar32 + 1;
                    } while (lVar25 - lVar26 != lVar32);
                    lVar19 = 0x1f;
LAB_00ab00df:
                    pfVar13 = (float *)(local_d8 + lVar19 * 4);
                    fVar37 = (float)(int)uVar30;
                  }
                  fVar38 = fVar38 + (float)(int)uVar30;
                  *pfVar13 = fVar37 + *pfVar13;
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != iVar33 - 1);
          }
          bVar35 = iVar11 != iVar28 + -2;
          lVar22 = lVar2;
          iVar11 = iVar11 + 1;
        } while (bVar35);
      }
      lVar22 = 0;
      do {
        auVar7._4_4_ = fVar38;
        auVar7._0_4_ = fVar38;
        auVar7._8_4_ = fVar38;
        auVar7._12_4_ = fVar38;
        auVar36 = divps(*(undefined1 (*) [16])(local_d8 + lVar22 * 4),auVar7);
        *(undefined1 (*) [16])(local_d8 + lVar22 * 4) = auVar36;
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x20);
    }
    else {
      if (iVar28 < 3) {
        fVar38 = 0.1;
      }
      else {
        fVar38 = 0.1;
        lVar22 = lVar22 * 2;
        iVar11 = 1;
        do {
          lVar2 = lVar22 + lVar16 * 2;
          if (2 < iVar33) {
            uVar21 = 1;
            do {
              puVar1 = (ushort *)(lVar22 + lVar16 * 2 + -2 + uVar21 * 2);
              puVar27 = (ushort *)(lVar2 + uVar21 * 2 + 2);
              iVar17 = (uint)puVar27[-lVar16] + (uint)*puVar27 * 2 + (uint)puVar27[lVar16];
              iVar24 = (uint)puVar1[-lVar16] + (uint)*puVar1 * 2 + (uint)puVar1[lVar16];
              iVar12 = (uint)puVar1[lVar16] + (uint)puVar27[lVar16] +
                       (uint)*(ushort *)(lVar2 + lVar16 * 2 + uVar21 * 2) * 2;
              iVar29 = (uint)*(ushort *)(lVar22 + 2 + uVar21 * 2) +
                       (uint)*(ushort *)(lVar22 + -2 + uVar21 * 2) +
                       (uint)*(ushort *)(lVar22 + uVar21 * 2) * 2;
              iVar34 = iVar17 - iVar24;
              if ((iVar34 != 0) || (iVar12 != iVar29)) {
                iVar12 = iVar12 - iVar29;
                iVar29 = -iVar34;
                if (0 < iVar34) {
                  iVar29 = iVar34;
                }
                iVar31 = -iVar12;
                if (0 < iVar12) {
                  iVar31 = iVar12;
                }
                uVar30 = iVar31 + iVar29;
                if (uVar30 != 0) {
                  if (iVar17 == iVar24) {
                    local_d8 = (undefined1  [4])((float)local_d8 + (float)(uVar30 >> 1));
                    pfVar13 = (float *)(local_68 + 0xc);
                    fVar37 = (float)(uVar30 >> 1);
                  }
                  else {
                    iVar34 = (iVar12 * 0x10000) / iVar34;
                    if (iVar34 < -0x11a6e) {
                      lVar26 = 8;
                      lVar23 = 0;
                    }
                    else if (iVar34 < -0xc79) {
                      lVar26 = 0x10;
                      lVar23 = 8;
                    }
                    else {
                      lVar26 = (ulong)(0xe821 < iVar34) * 8;
                      lVar23 = lVar26 + 0x10;
                      lVar26 = lVar26 + 0x18;
                    }
                    lVar25 = lVar23 << 0x20;
                    lVar19 = 0;
                    do {
                      if (iVar34 <= *(int *)((long)&get_hist_bin_idx_thresholds +
                                            (ulong)(uint)((int)lVar23 << 2) + lVar19 * 4)) {
                        lVar25 = lVar25 >> 0x20;
                        goto LAB_00ab02e1;
                      }
                      lVar25 = lVar25 + 0x100000000;
                      lVar19 = lVar19 + 1;
                    } while (lVar26 - lVar23 != lVar19);
                    lVar25 = 0x1f;
LAB_00ab02e1:
                    pfVar13 = (float *)(local_d8 + lVar25 * 4);
                    fVar37 = (float)(int)uVar30;
                  }
                  fVar38 = fVar38 + (float)(int)uVar30;
                  *pfVar13 = fVar37 + *pfVar13;
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != iVar33 - 1);
          }
          bVar35 = iVar11 != iVar28 + -2;
          lVar22 = lVar2;
          iVar11 = iVar11 + 1;
        } while (bVar35);
      }
      lVar22 = 0;
      do {
        auVar36._4_4_ = fVar38;
        auVar36._0_4_ = fVar38;
        auVar36._8_4_ = fVar38;
        auVar36._12_4_ = fVar38;
        auVar36 = divps(*(undefined1 (*) [16])(local_d8 + lVar22 * 4),auVar36);
        *(undefined1 (*) [16])(local_d8 + lVar22 * 4) = auVar36;
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x20);
    }
  }
  fVar38 = (float)((iVar4 + 1) * (iVar5 + 1));
  lVar22 = 0;
  do {
    lVar16 = lVar22 * 4;
    fVar37 = *(float *)(local_d8 + lVar16 + 4);
    fVar9 = *(float *)(local_d8 + lVar16 + 8);
    fVar10 = *(float *)(local_c8 + lVar16 + -4);
    lVar2 = lVar22 * 4;
    *(float *)(local_d8 + lVar2) = *(float *)(local_d8 + lVar16) * fVar38;
    *(float *)(local_d8 + lVar2 + 4) = fVar37 * fVar38;
    *(float *)(local_d8 + lVar2 + 8) = fVar9 * fVar38;
    *(float *)(local_c8 + lVar2 + -4) = fVar10 * fVar38;
    lVar22 = lVar22 + 4;
  } while (lVar22 != 0x20);
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  (*av1_nn_predict)((float *)local_d8,&av1_intra_hog_model_nnconfig,1,local_58);
  lVar22 = 0;
  do {
    fVar38 = local_58[lVar22 + 1];
    fVar37 = local_58[lVar22 + 2];
    fVar9 = local_58[lVar22 + 3];
    if (local_58[lVar22] <= th) {
      directional_mode_skip_mask[lVar22 + 1] = '\x01';
    }
    if (fVar38 <= th) {
      directional_mode_skip_mask[lVar22 + 2] = '\x01';
    }
    if (fVar37 <= th) {
      directional_mode_skip_mask[lVar22 + 3] = '\x01';
    }
    if (fVar9 <= th) {
      directional_mode_skip_mask[lVar22 + 4] = '\x01';
    }
    lVar22 = lVar22 + 4;
  } while (lVar22 != 8);
  return;
}

Assistant:

static inline void prune_intra_mode_with_hog(
    const MACROBLOCK *x, BLOCK_SIZE bsize, BLOCK_SIZE sb_size, float th,
    uint8_t *directional_mode_skip_mask, int is_chroma) {
  const int plane = is_chroma ? AOM_PLANE_U : AOM_PLANE_Y;
  float hist[BINS] = { 0.0f };
  collect_hog_data(x, bsize, sb_size, plane, hist);

  // Make prediction for each of the mode
  float scores[DIRECTIONAL_MODES] = { 0.0f };
  av1_nn_predict(hist, &av1_intra_hog_model_nnconfig, 1, scores);
  for (UV_PREDICTION_MODE uv_mode = UV_V_PRED; uv_mode <= UV_D67_PRED;
       uv_mode++) {
    if (scores[uv_mode - UV_V_PRED] <= th) {
      directional_mode_skip_mask[uv_mode] = 1;
    }
  }
}